

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CESkyCoord.cpp
# Opt level: O3

CEAngle __thiscall
CESkyCoord::AngularSeparation(CESkyCoord *this,CESkyCoord *coords1,CESkyCoord *coords2)

{
  CESkyCoordType CVar1;
  CESkyCoordType CVar2;
  invalid_value *this_00;
  double dVar3;
  double extraout_XMM0_Qa;
  CEAngle CVar4;
  double y2;
  double y1;
  undefined1 local_120 [32];
  CEAngle local_100;
  double local_f0;
  _func_int **local_e8;
  CEAngle local_e0;
  CEAngle local_d0;
  CEAngle local_c0;
  CEDate local_b0;
  CEDate local_70;
  double local_30;
  
  CVar1 = GetCoordSystem(coords1);
  CVar2 = GetCoordSystem(coords2);
  if (CVar1 == CVar2) {
    dVar3 = CppEphem::julian_date_J2000();
    CEDate::CEDate(&local_70,dVar3,JD);
    (*coords1->_vptr_CESkyCoord[4])(&local_b0,coords1,&local_70);
    local_120._24_8_ = CEAngle::Rad((CEAngle *)&local_b0);
    CEAngle::~CEAngle((CEAngle *)&local_b0);
    CEDate::~CEDate(&local_70);
    local_e8 = (_func_int **)local_120._24_8_;
    dVar3 = CppEphem::julian_date_J2000();
    CEDate::CEDate(&local_70,dVar3,JD);
    (*coords2->_vptr_CESkyCoord[4])(&local_b0,coords2,&local_70);
    local_120._16_8_ = CEAngle::Rad((CEAngle *)&local_b0);
    CEAngle::~CEAngle((CEAngle *)&local_b0);
    CEDate::~CEDate(&local_70);
    local_f0 = (double)local_120._16_8_;
    CVar1 = GetCoordSystem(coords1);
    if (CVar1 == OBSERVED) {
      local_e8 = (_func_int **)(1.5707963267948966 - (double)local_120._24_8_);
      local_f0 = 1.5707963267948966 - (double)local_120._16_8_;
    }
    dVar3 = CppEphem::julian_date_J2000();
    CEDate::CEDate(&local_70,dVar3,JD);
    (*coords1->_vptr_CESkyCoord[3])(local_120 + 0x20,coords1,&local_70);
    CEAngle::CEAngle(&local_c0,(double *)&local_e8);
    dVar3 = CppEphem::julian_date_J2000();
    CEDate::CEDate(&local_b0,dVar3,JD);
    (*coords2->_vptr_CESkyCoord[3])(&local_d0,coords2,&local_b0);
    CEAngle::CEAngle(&local_e0,&local_f0);
    AngularSeparation((CESkyCoord *)local_120,(CEAngle *)(local_120 + 0x20),&local_c0,&local_d0,
                      &local_e0);
    local_30 = CEAngle::operator_cast_to_double((CEAngle *)local_120);
    CEAngle::CEAngle((CEAngle *)this,&local_30);
    CEAngle::~CEAngle((CEAngle *)local_120);
    CEAngle::~CEAngle(&local_e0);
    CEAngle::~CEAngle(&local_d0);
    CEDate::~CEDate(&local_b0);
    CEAngle::~CEAngle(&local_c0);
    CEAngle::~CEAngle((CEAngle *)(local_120 + 0x20));
    CEDate::~CEDate(&local_70);
    CVar4.angle_ = extraout_XMM0_Qa;
    CVar4._vptr_CEAngle = (_func_int **)this;
    return CVar4;
  }
  this_00 = (invalid_value *)__cxa_allocate_exception(0xa8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_70,"CESkyCoord::AngularSeparation(CESkyCoord&, CESkyCoord&)",
             (allocator *)local_120);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_b0,"Supplied coordinates are in different frames",
             (allocator *)(local_120 + 0x20));
  CEException::invalid_value::invalid_value(this_00,(string *)&local_70,(string *)&local_b0);
  __cxa_throw(this_00,&CEException::invalid_value::typeinfo,CEExceptionHandler::~CEExceptionHandler)
  ;
}

Assistant:

CEAngle CESkyCoord::AngularSeparation(const CESkyCoord& coords1, 
                                      const CESkyCoord& coords2)
{
    // Make sure the coordinates are in the same frame
    if (coords1.GetCoordSystem() != coords2.GetCoordSystem()) {
        throw CEException::invalid_value("CESkyCoord::AngularSeparation(CESkyCoord&, CESkyCoord&)",
                                         "Supplied coordinates are in different frames");
    }

    // Get the appropriate Y-Coordinates
    double y1 = coords1.YCoord().Rad();
    double y2 = coords2.YCoord().Rad();
    if (coords1.GetCoordSystem() == CESkyCoordType::OBSERVED) {
        y1 = M_PI_2 - y1;
        y2 = M_PI_2 - y2;
    }

    // Convert the second coordinates to be the same type as the first set of coordinates
    return AngularSeparation(coords1.XCoord(), y1,
                             coords2.XCoord(), y2);
}